

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elsa.h
# Opt level: O1

size_t __thiscall
frozen::bits::pmh_tables<16ul,frozen::elsa<unsigned_char>>::
lookup<unsigned_char,frozen::elsa<unsigned_char>>
          (pmh_tables<16ul,frozen::elsa<unsigned_char>> *this,uchar *key,elsa<unsigned_char> *hasher
          )

{
  uint uVar1;
  ulong uVar2;
  
  uVar2 = *(ulong *)this ^ (ulong)*key;
  uVar2 = uVar2 * 0x200000 + ~uVar2;
  uVar2 = (uVar2 >> 0x18 ^ uVar2) * 0x109;
  uVar1 = ((uint)(uVar2 >> 0xe) ^ (uint)uVar2) * 0x15;
  uVar2 = *(ulong *)(this + (ulong)((uVar1 >> 0x1c ^ uVar1) & 0xf) * 8 + 8);
  if (-1 < (long)uVar2) {
    return uVar2;
  }
  uVar2 = uVar2 ^ *key;
  uVar2 = uVar2 * 0x200000 + ~uVar2;
  uVar2 = (uVar2 >> 0x18 ^ uVar2) * 0x109;
  uVar1 = ((uint)(uVar2 >> 0xe) ^ (uint)uVar2) * 0x15;
  return *(size_t *)(this + (ulong)((uVar1 >> 0x1c ^ uVar1) & 0xf) * 8 + 0x88);
}

Assistant:

constexpr std::size_t operator()(T const &value, std::size_t seed) const {
    std::size_t key = seed ^ static_cast<std::size_t>(value);
    key = (~key) + (key << 21); // key = (key << 21) - key - 1;
    key = key ^ (key >> 24);
    key = (key + (key << 3)) + (key << 8); // key * 265
    key = key ^ (key >> 14);
    key = (key + (key << 2)) + (key << 4); // key * 21
    key = key ^ (key >> 28);
    key = key + (key << 31);
    return key;
  }